

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O3

int Cec2_ManSweepNode(Cec2_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  Gia_Rpr_t *pGVar2;
  long *plVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  Gia_Man_t *pGVar7;
  word *pwVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  Vec_Int_t *pVVar12;
  satoko_stats_t *psVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  Gia_Obj_t *pGVar19;
  uint uVar20;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar10 = clock_gettime(3,&local_48);
  if (iVar10 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (-1 < iObj) {
    pGVar7 = p->pAig;
    if (iObj < pGVar7->nObjs) {
      uVar15 = (ulong)(uint)pGVar7->pReprs[(uint)iObj] & 0xfffffff;
      if (uVar15 == 0xfffffff) {
        pGVar19 = (Gia_Obj_t *)0x0;
      }
      else {
        if ((uint)pGVar7->nObjs <= (uint)uVar15) goto LAB_00652837;
        pGVar19 = pGVar7->pObjs + uVar15;
      }
      pGVar1 = pGVar7->pObjs + (uint)iObj;
      uVar17 = pGVar1->Value;
      if (-1 < (int)uVar17) {
        uVar6 = pGVar19->Value;
        local_38 = lVar14;
        if (-1 < (int)uVar6) {
          uVar16 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x3f) ^ (uVar6 ^ uVar17) & 1;
          uVar20 = -(int)((long)*(undefined8 *)pGVar19 >> 0x3f);
          iVar10 = Cec2_ManSolveTwo(p,uVar6 >> 1,uVar17 >> 1,uVar16 ^ uVar20);
          if (iVar10 == -1) {
            p->nSatUnsat = p->nSatUnsat + 1;
            if ((int)pGVar19->Value < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            pGVar1->Value = pGVar19->Value ^ (uint)(uVar16 != uVar20);
            pGVar2 = p->pAig->pReprs + (uint)iObj;
            *pGVar2 = (Gia_Rpr_t)((uint)*pGVar2 | 0x10000000);
            iVar10 = clock_gettime(3,&local_48);
            if (iVar10 < 0) {
              lVar14 = -1;
            }
            else {
              lVar14 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            iVar10 = 1;
            lVar18 = 0x70;
          }
          else if (iVar10 == 1) {
            uVar4 = p->nPatterns;
            uVar5 = p->nSatSat;
            p->nPatterns = uVar4 + 1;
            p->nSatSat = uVar5 + 1;
            pGVar7 = p->pAig;
            iVar11 = pGVar7->nSimWords * 0x40;
            iVar10 = 1;
            if (pGVar7->iPatsPi != iVar11 + -1) {
              iVar10 = pGVar7->iPatsPi + 1;
            }
            pGVar7->iPatsPi = iVar10;
            if ((iVar10 < 1) || (iVar11 <= iVar10)) {
              __assert_fail("p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                            ,0x36d,"int Cec2_ManSweepNode(Cec2_Man_t *, int)");
            }
            pVVar12 = p->vObjSatPairs;
            if (1 < pVVar12->nSize) {
              lVar14 = 1;
              do {
                iVar10 = pVVar12->pArray[lVar14 + -1];
                pGVar7 = p->pAig;
                cVar9 = satoko_var_polarity(p->pSat,pVVar12->pArray[lVar14]);
                uVar17 = iVar10 * pGVar7->nSimWords;
                if (((int)uVar17 < 0) || (pGVar7->vSims->nSize <= (int)uVar17)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                }
                pwVar8 = pGVar7->vSims->pArray;
                lVar18 = (long)(pGVar7->iPatsPi >> 5);
                uVar6 = *(uint *)((long)pwVar8 + lVar18 * 4 + (ulong)uVar17 * 8);
                uVar16 = pGVar7->iPatsPi & 0x1f;
                if (((cVar9 != '\0' ^ (byte)(uVar6 >> (sbyte)uVar16)) & 1) == 0) {
                  *(uint *)((long)pwVar8 + lVar18 * 4 + (ulong)uVar17 * 8) = uVar6 ^ 1 << uVar16;
                }
                pVVar12 = p->vObjSatPairs;
                lVar14 = lVar14 + 2;
              } while ((int)lVar14 < pVVar12->nSize);
            }
            iVar10 = clock_gettime(3,&local_48);
            if (iVar10 < 0) {
              lVar14 = -1;
            }
            else {
              lVar14 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            iVar10 = 0;
            lVar18 = 0x68;
          }
          else {
            p->nSatUndec = p->nSatUndec + 1;
            if (iVar10 != 0) {
              __assert_fail("status == SATOKO_UNDEC",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                            ,0x37e,"int Cec2_ManSweepNode(Cec2_Man_t *, int)");
            }
            pGVar2 = p->pAig->pReprs + (uint)iObj;
            *pGVar2 = (Gia_Rpr_t)((uint)*pGVar2 | 0x20000000);
            iVar10 = clock_gettime(3,&local_48);
            if (iVar10 < 0) {
              lVar14 = -1;
            }
            else {
              lVar14 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            iVar10 = 2;
            lVar18 = 0x78;
          }
          plVar3 = (long *)((long)&p->pPars + lVar18);
          *plVar3 = *plVar3 + lVar14 + local_38;
          if (p->pPars->fUseCones == 0) {
            iVar11 = clock_gettime(3,&local_48);
            if (iVar11 < 0) {
              lVar14 = 1;
            }
            else {
              lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
              lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_48.tv_sec * -1000000;
            }
            satoko_rollback(p->pSat);
            iVar11 = clock_gettime(3,&local_48);
            if (iVar11 < 0) {
              lVar18 = -1;
            }
            else {
              lVar18 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            p->timeExtra = p->timeExtra + lVar18 + lVar14;
            psVar13 = satoko_stats(p->pSat);
            psVar13->n_conflicts = 0;
          }
          return iVar10;
        }
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
  }
LAB_00652837:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Cec2_ManSweepNode( Cec2_Man_t * p, int iObj )
{
    abctime clk = Abc_Clock();
    int i, IdAig, IdSat, status, RetValue = 1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pAig, iObj );
    Gia_Obj_t * pRepr = Gia_ObjReprObj( p->pAig, iObj );
    int fCompl = Abc_LitIsCompl(pObj->Value) ^ Abc_LitIsCompl(pRepr->Value) ^ pObj->fPhase ^ pRepr->fPhase;
    status = Cec2_ManSolveTwo( p, Abc_Lit2Var(pRepr->Value), Abc_Lit2Var(pObj->Value), fCompl );
    if ( status == SATOKO_SAT )
    {
        p->nSatSat++;
        p->nPatterns++;
        p->pAig->iPatsPi = (p->pAig->iPatsPi == 64 * p->pAig->nSimWords - 1) ? 1 : p->pAig->iPatsPi + 1;
        assert( p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords );
        Vec_IntForEachEntryDouble( p->vObjSatPairs, IdAig, IdSat, i )
            Cec2_ObjSimSetInputBit( p->pAig, IdAig, satoko_var_polarity(p->pSat, IdSat) == SATOKO_LIT_TRUE );
        p->timeSatSat += Abc_Clock() - clk;
        RetValue = 0;
    }
    else if ( status == SATOKO_UNSAT )
    {
        p->nSatUnsat++;
        pObj->Value = Abc_LitNotCond( pRepr->Value, fCompl );
        Gia_ObjSetProved( p->pAig, iObj );
        p->timeSatUnsat += Abc_Clock() - clk;
        RetValue = 1;
    }
    else 
    {
        p->nSatUndec++;
        assert( status == SATOKO_UNDEC );
        Gia_ObjSetFailed( p->pAig, iObj );
        p->timeSatUndec += Abc_Clock() - clk;
        RetValue = 2;
    }
    if ( p->pPars->fUseCones )
        return RetValue;
    clk = Abc_Clock();
    satoko_rollback( p->pSat );
    p->timeExtra += Abc_Clock() - clk;
    satoko_stats(p->pSat)->n_conflicts = 0;
    return RetValue;
}